

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O0

LIBSSH2_KNOWNHOSTS * libssh2_knownhost_init(LIBSSH2_SESSION *session)

{
  LIBSSH2_KNOWNHOSTS *knh;
  LIBSSH2_SESSION *session_local;
  
  session_local = (LIBSSH2_SESSION *)(*session->alloc)(0x18,&session->abstract);
  if (session_local == (LIBSSH2_SESSION *)0x0) {
    _libssh2_error(session,-6,"Unable to allocate memory for known-hosts collection");
    session_local = (LIBSSH2_SESSION *)0x0;
  }
  else {
    session_local->abstract = session;
    _libssh2_list_init((list_head *)&session_local->alloc);
  }
  return (LIBSSH2_KNOWNHOSTS *)session_local;
}

Assistant:

LIBSSH2_API LIBSSH2_KNOWNHOSTS *
libssh2_knownhost_init(LIBSSH2_SESSION *session)
{
    LIBSSH2_KNOWNHOSTS *knh =
        LIBSSH2_ALLOC(session, sizeof(struct _LIBSSH2_KNOWNHOSTS));

    if(!knh) {
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to allocate memory for known-hosts "
                       "collection");
        return NULL;
    }

    knh->session = session;

    _libssh2_list_init(&knh->head);

    return knh;
}